

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

Privkey * __thiscall
cfd::core::Privkey::CreateTweakAdd(Privkey *__return_storage_ptr__,Privkey *this,ByteData256 *tweak)

{
  undefined1 local_38 [8];
  ByteData tweak_added;
  ByteData256 *tweak_local;
  Privkey *this_local;
  
  tweak_added.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)tweak;
  WallyUtil::AddTweakPrivkey((ByteData *)local_38,&this->data_,tweak);
  Privkey(__return_storage_ptr__,(ByteData *)local_38,kMainnet,true);
  ByteData::~ByteData((ByteData *)0x451c93);
  return __return_storage_ptr__;
}

Assistant:

Privkey Privkey::CreateTweakAdd(const ByteData256 &tweak) const {
  ByteData tweak_added = WallyUtil::AddTweakPrivkey(data_, tweak);
  return Privkey(tweak_added);
}